

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O0

int PosixMemalign(void **ptr,size_t align,size_t size)

{
  int iVar1;
  unsigned_long __size;
  size_t size_local;
  size_t align_local;
  void **ptr_local;
  
  __size = noopt<unsigned_long>(size);
  iVar1 = posix_memalign(ptr,align,__size);
  iVar1 = noopt<int>(iVar1);
  return iVar1;
}

Assistant:

static inline int PosixMemalign(void** ptr, size_t align, size_t size) {
  return noopt(posix_memalign(ptr, align, noopt(size)));
}